

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void doran(dw_rom *rom)

{
  vpatch(rom,0x13b4,0x50,0x50,2,0x51,2,0x52,2,0x53,2,0x54,2,0x55,2,0x56,2,0x57,2,0x50,2,0x51,2,0x52,
         2,0x53,2,0x54,2,0x55,2,0x56,2,0x57,2,0x50,2,0x51,2,0x52,2,0x53,2,0x54,2,0x55,2,0x56,2,0x57,
         2,0x50,2,0x51,2,0x52,2,0x53,2,0x54,2,0x55,2,0x56,2,0x57,2,0x50);
  vpatch(rom,0x14b4,0x4e,0x48,2,0x49,2,0x4a,2,0x4b,2,0x4c,2,0x4d,2,0x4e,2,0x4f,2,0x48,2,0x49,2,0x4a,
         2,0x4b,2,0x4c,2,0x4d,2,0x4e,2,0x4f,2,0x48,2,0x49,2,0x4a,2,0x4b,2,0x4c,2,0x4d,2,0x4e,2,0x4f,
         2,0x48,2,0x49,2,0x4a,2,0x4b,2,0x4c,2,0x4d,2,0x4e,2,0x4f,2,0x48);
  vpatch(rom,0x15b4,0x44,0x30,2,0x31,2,0x32,2,0x33,2,0x34,2,0x35,2,0x36,2,0x37,2,0x30,2,0x31,2,0x32,
         2,0x33,2,0x34,2,0x35,2,0x36,2,0x37,2,0x30,2,0x31,2,0x32,2,0x33,2,0x34,2,0x35,2,0x36,2,0x37,
         2,0x30,2,0x31,2,0x32,2,0x33,2,0x34,2,0x35,2,0x36,2,0x37,2,0xb4);
  vpatch(rom,0x15fe,2,0x35,2);
  vpatch(rom,0x16b4,0x44,0x40,2,0x41,2,0x42,2,0x43,2,0x44,2,0x45,2,0x46,2,0x47,2,0x40,2,0x41,2,0x42,
         2,0x43,2,0x44,2,0x45,2,0x46,2,0x47,2,0x40,2,0x41,2,0x42,2,0x43,2,0x44,2,0x45,2,0x46,2,0x47,
         2,0x40,2,0x41,2,0x42,2,0x43,2,0x44,2,0x45,2,0x46,2,0x47,2,0xb8);
  vpatch(rom,0x16fe,2,0x45,2);
  vpatch(rom,0x1a8d,7,0x11,0x35,0x27,0x1a,0x27,0x20,0x18);
  vpatch(rom,0x12300,0x80,0xf7,0x7f,0x7f,0x7f,0x33,0x37,0x7f,0xff,0x97,0x49,0x50,0x51,0x2d,0x2c,0x70
         ,0x9a,0xc0,0xe0,0xf0,0xf0,0x98,0xd8,0xf0,0xf8,0xc0,0x20,0x10,0x10,0x68,0x68,0x10,0xb8,0xff,
         0x7f,0x3c,0x78,0x78,0x3c,0x7f,0x78,0x84,99,0x23,0x47,0x47,0x27,0x47,0x78,0xfc,0xfe,0x7f,
         0x3f,0x3e,0x7c,0xf8,0xfc,0x44,0x82,0x89,0xc9,0xc6,0xc4,0x98,0x84,3);
  vpatch(rom,0x12400,0x180,0x1e,0x3f,0x67,0x6f,0x7f,0xe3,199,0xcf,0x1e,0x21,0x5a,0x58,0x40,0x9c,0x7e
         ,0x3a,6,0xd,0x8d,0xdd,0xdd,0xdd,0x9d,0xdd,5,0xb,0x8b,0x53,0x53,0x53,0x93,0xd3,0x9f,0xfb,
         0x17,0x17,0x17,0xf,0x1f,0x3f,100,0xed,0x1a,0x1f,0x1c,8,0x19,0x21,0xfd,0xfd,0xfd,0xfa,0xe4,
         0xf8,0xf0,0xe0,0x23,0x43,0x43,0x86,0x3c,0x98,0x10,0xe0,0x1e);
  vpatch(rom,0x12b22,0xe,0xf0,0xf8,0x71,0x3f,0x1f,0x3f,0xfe,0x78,0x9f,0x8f,0x6f,0x22,0x19,0x21);
  vpatch(rom,0x12b35,3,0x90,0xa2,0x1e);
  vpatch(rom,0x12b3e,2,0xfe,0x1e);
  vpatch(rom,0x12b60,0x10,0xe3,0x67,0x30,0x78,0x71,0x3f,0x7f,0x78,0xfe,0x78,0x1f,0x4f,0x4f,0x20,0x47
         ,0x78);
  vpatch(rom,0x12b77,1,0xfc);
  vpatch(rom,0x12b7e,2,0xfc,0x84);
  return;
}

Assistant:

static void doran(dw_rom *rom)
{
    vpatch(rom, 0x013b4,   80,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02);
    vpatch(rom, 0x014b4,   78,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x02,  0x4b,  0x02,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x02,  0x4f,  0x02,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x02,  0x4b,  0x02,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x02,  0x4f,  0x02,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x02,  0x4b,  0x02,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x02,  0x4f,  0x02,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x02,  0x4b,  0x02,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x02,  0x4f,  0x02,  0x48,  0x02,  0xa9,  0x03,  0x4a,  0x02,  0xab,  0x03,  0x4c,  0x02,  0xad,  0x03,  0x4e,  0x02);
    vpatch(rom, 0x015b4,   68,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0xb4,  0x03,  0x31,  0x02);
    vpatch(rom, 0x015fe,    2,  0x35,  0x02);
    vpatch(rom, 0x016b4,   68,  0x40,  0x02,  0x41,  0x02,  0x42,  0x02,  0x43,  0x02,  0x44,  0x02,  0x45,  0x02,  0x46,  0x02,  0x47,  0x02,  0x40,  0x02,  0x41,  0x02,  0x42,  0x02,  0x43,  0x02,  0x44,  0x02,  0x45,  0x02,  0x46,  0x02,  0x47,  0x02,  0x40,  0x02,  0x41,  0x02,  0x42,  0x02,  0x43,  0x02,  0x44,  0x02,  0x45,  0x02,  0x46,  0x02,  0x47,  0x02,  0x40,  0x02,  0x41,  0x02,  0x42,  0x02,  0x43,  0x02,  0x44,  0x02,  0x45,  0x02,  0x46,  0x02,  0x47,  0x02,  0xb8,  0x03,  0x41,  0x02);
    vpatch(rom, 0x016fe,    2,  0x45,  0x02);
    vpatch(rom, 0x01a8d,    7,  0x11,  0x35,  0x27,  0x1a,  0x27,  0x20,  0x18);
    vpatch(rom, 0x12300,  128,  0xf7,  0x7f,  0x7f,  0x7f,  0x33,  0x37,  0x7f,  0xff,  0x97,  0x49,  0x50,  0x51,  0x2d,  0x2c,  0x70,  0x9a,  0xc0,  0xe0,  0xf0,  0xf0,  0x98,  0xd8,  0xf0,  0xf8,  0xc0,  0x20,  0x10,  0x10,  0x68,  0x68,  0x10,  0xb8,  0xff,  0x7f,  0x3c,  0x78,  0x78,  0x3c,  0x7f,  0x78,  0x84,  0x63,  0x23,  0x47,  0x47,  0x27,  0x47,  0x78,  0xfc,  0xfe,  0x7f,  0x3f,  0x3e,  0x7c,  0xf8,  0xfc,  0x44,  0x82,  0x89,  0xc9,  0xc6,  0xc4,  0x98,  0x84,  0x03,  0x07,  0x0f,  0x0f,  0x19,  0x1b,  0x0f,  0x1f,  0x03,  0x04,  0x08,  0x08,  0x16,  0x16,  0x08,  0x1d,  0xef,  0xfe,  0xfe,  0xfe,  0xcc,  0xec,  0xfe,  0xff,  0xe9,  0x92,  0x0a,  0x8a,  0xb4,  0x34,  0x0e,  0x59,  0x3f,  0x7f,  0xfe,  0xfc,  0x7c,  0x3e,  0x1f,  0x3f,  0x22,  0x41,  0x91,  0x93,  0x63,  0x23,  0x19,  0x21,  0xff,  0xfe,  0x3c,  0x1e,  0x1e,  0x3c,  0xfe,  0x1e,  0x21,  0xc6,  0xc4,  0xe2,  0xe2,  0xe4,  0xe2,  0x1e);
    vpatch(rom, 0x12400,  384,  0x1e,  0x3f,  0x67,  0x6f,  0x7f,  0xe3,  0xc7,  0xcf,  0x1e,  0x21,  0x5a,  0x58,  0x40,  0x9c,  0x7e,  0x3a,  0x06,  0x0d,  0x8d,  0xdd,  0xdd,  0xdd,  0x9d,  0xdd,  0x05,  0x0b,  0x8b,  0x53,  0x53,  0x53,  0x93,  0xd3,  0x9f,  0xfb,  0x17,  0x17,  0x17,  0x0f,  0x1f,  0x3f,  0x64,  0xed,  0x1a,  0x1f,  0x1c,  0x08,  0x19,  0x21,  0xfd,  0xfd,  0xfd,  0xfa,  0xe4,  0xf8,  0xf0,  0xe0,  0x23,  0x43,  0x43,  0x86,  0x3c,  0x98,  0x10,  0xe0,  0x1e,  0x3f,  0x67,  0x6f,  0x7f,  0xe3,  0xc7,  0xcf,  0x1e,  0x21,  0x5a,  0x58,  0x40,  0x9c,  0x7e,  0x3a,  0x06,  0x0d,  0x8d,  0xdd,  0xdd,  0xdd,  0x9d,  0xdd,  0x05,  0x0b,  0x8b,  0x53,  0x53,  0x53,  0x93,  0xd3,  0x9f,  0xff,  0x17,  0x17,  0x17,  0x0f,  0x0f,  0x1f,  0x79,  0xfc,  0x1b,  0x1c,  0x1c,  0x08,  0x0e,  0x10,  0xfd,  0xfd,  0xfd,  0xfa,  0xe4,  0xf8,  0xc0,  0xc0,  0x23,  0x03,  0x03,  0x86,  0x3c,  0x78,  0x40,  0x40,  0x60,  0xb0,  0xb1,  0xbb,  0xbb,  0xbb,  0xb9,  0xbb,  0xa0,  0xd0,  0xd1,  0xca,  0xca,  0xca,  0xc9,  0xcb,  0x78,  0xfc,  0xe6,  0xf6,  0xfe,  0xc7,  0xe3,  0xf3,  0x78,  0x84,  0x5a,  0x1a,  0x02,  0x39,  0x7e,  0x5c,  0xbf,  0xbf,  0xbf,  0x5f,  0x27,  0x1f,  0x03,  0x03,  0xc4,  0xc0,  0xc0,  0x61,  0x3c,  0x1e,  0x02,  0x02,  0xf9,  0xff,  0xe8,  0xe8,  0xe8,  0xf0,  0xf0,  0xf8,  0x9e,  0x3f,  0xd8,  0x38,  0x38,  0x10,  0x70,  0x08,  0x60,  0xb0,  0xb1,  0xbb,  0xbb,  0xbb,  0xb9,  0xbb,  0xa0,  0xd0,  0xd1,  0xca,  0xca,  0xca,  0xc9,  0xcb,  0x78,  0xfc,  0xe6,  0xf6,  0xfe,  0xc7,  0xe3,  0xf3,  0x78,  0x84,  0x5a,  0x1a,  0x02,  0x39,  0x7e,  0x5c,  0xbf,  0xbf,  0xbf,  0x5f,  0x27,  0x1f,  0x0f,  0x07,  0xc4,  0xc2,  0xc2,  0x61,  0x3c,  0x19,  0x08,  0x07,  0xf9,  0xdf,  0xe8,  0xe8,  0xe8,  0xf0,  0xf8,  0xfc,  0x26,  0xb7,  0x58,  0xf8,  0x38,  0x10,  0x98,  0x84,  0xf7,  0x7f,  0x5f,  0x5f,  0x2f,  0x2f,  0x17,  0x37,  0x97,  0x49,  0x68,  0x65,  0x35,  0x32,  0x1a,  0x39,  0xc0,  0xe0,  0xf0,  0xf0,  0xf8,  0xf8,  0xfc,  0xfe,  0xc0,  0x20,  0x10,  0x10,  0x08,  0x08,  0x0c,  0x02,  0x73,  0xf9,  0xf8,  0xfc,  0xfc,  0x3e,  0x7d,  0x78,  0x5c,  0x8e,  0x2f,  0x07,  0xc3,  0x27,  0x45,  0x78,  0xfe,  0xfc,  0xf8,  0xf8,  0x7c,  0x7c,  0xf8,  0xfc,  0x82,  0x4c,  0x28,  0x28,  0xc4,  0xc4,  0x98,  0x84,  0x03,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0x3f,  0x7f,  0x03,  0x04,  0x08,  0x08,  0x10,  0x10,  0x30,  0x40,  0xef,  0xfe,  0xfa,  0xfa,  0xf4,  0xf4,  0xe8,  0xec,  0xe9,  0x92,  0x16,  0xa6,  0xac,  0x4c,  0x58,  0x9c,  0x7f,  0x3f,  0x1f,  0x1f,  0x3e,  0x3e,  0x1f,  0x3f,  0x41,  0x32,  0x14,  0x14,  0x23,  0x23,  0x19,  0x21,  0xce,  0x9f,  0x1f,  0x3f,  0x3f,  0x7c,  0xbe,  0x1e,  0x3a,  0x71,  0xf4,  0xe0,  0xc3,  0xe4,  0xa2,  0x1e);
    vpatch(rom, 0x12b22,   14,  0xf0,  0xf8,  0x71,  0x3f,  0x1f,  0x3f,  0xfe,  0x78,  0x9f,  0x8f,  0x6f,  0x22,  0x19,  0x21);
    vpatch(rom, 0x12b35,    3,  0x90,  0xa2,  0x1e);
    vpatch(rom, 0x12b3e,    2,  0xfe,  0x1e);
    vpatch(rom, 0x12b60,   16,  0xe3,  0x67,  0x30,  0x78,  0x71,  0x3f,  0x7f,  0x78,  0xfe,  0x78,  0x1f,  0x4f,  0x4f,  0x20,  0x47,  0x78);
    vpatch(rom, 0x12b77,    1,  0xfc);
    vpatch(rom, 0x12b7e,    2,  0xfc,  0x84);
}